

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall CLI::App::_parse_single_config(App *this,ConfigItem *item,size_t level)

{
  undefined8 this_00;
  bool bVar1;
  config_extras_mode cVar2;
  MultiOptionPolicy MVar3;
  bool bVar4;
  __type _Var5;
  int iVar6;
  size_type sVar7;
  const_reference pvVar8;
  App *this_01;
  Option *pOVar9;
  long lVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  ConfigError *__return_storage_ptr__;
  element_type *peVar11;
  int64_t iVar12;
  int *piVar13;
  string *psVar14;
  ArgumentMismatch *__return_storage_ptr___00;
  ConversionError *__return_storage_ptr___01;
  reference __lhs;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_03;
  InvalidError *this_04;
  undefined1 *local_498;
  bool local_431;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_418;
  undefined1 local_3fa;
  allocator local_3f9;
  string local_3f8;
  string local_3d8;
  reference local_3b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *valid_res;
  iterator __end6;
  iterator __begin6;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range6;
  bool valid_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *res_1;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  string local_368;
  undefined1 local_341;
  string local_340;
  int local_31c;
  string local_318;
  string local_2f8;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  string local_290;
  string local_270;
  int64_t local_250;
  int64_t val;
  undefined1 local_240 [7];
  bool converted;
  string res;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *inputs;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_210;
  const_iterator local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f0;
  const_iterator local_1e8;
  byte local_1d9;
  undefined1 local_1d8 [7];
  bool useBuffer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  buffer;
  string local_1b8;
  Classifier local_194;
  reference local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string local_160;
  Classifier local_13c;
  string local_138;
  Option *local_118;
  Option *testop_2;
  Option *local_f0;
  Option *testop_1;
  Option *local_c8;
  Option *testop;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  Option *local_60;
  Option *op;
  string local_50;
  App *local_30;
  App *subcom;
  size_t level_local;
  ConfigItem *item_local;
  App *this_local;
  
  subcom = (App *)level;
  level_local = (size_t)item;
  item_local = (ConfigItem *)this;
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&item->parents);
  if (level < sVar7) {
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)level_local,(size_type)subcom);
    ::std::__cxx11::string::string((string *)&local_50,(string *)pvVar8);
    this_01 = get_subcommand_no_throw(this,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    if (this_01 == (App *)0x0) {
      local_431 = false;
    }
    else {
      local_30 = this_01;
      local_431 = _parse_single_config
                            (this_01,(ConfigItem *)level_local,
                             (size_t)((long)&subcom->_vptr_App + 1));
    }
    this_local._7_1_ = local_431;
    goto LAB_0016f1f9;
  }
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (level_local + 0x18),"++");
  if (bVar1) {
    if ((this->configurable_ & 1U) != 0) {
      increment_parsed(this);
      _trigger_pre_parse(this,2);
      if (this->parent_ != (App *)0x0) {
        op = (Option *)this;
        std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::push_back
                  (&this->parent_->parsed_subcommands_,(value_type *)&op);
      }
    }
    this_local._7_1_ = 1;
    goto LAB_0016f1f9;
  }
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (level_local + 0x18),"--");
  if (bVar1) {
    if (((this->configurable_ & 1U) != 0) &&
       (bVar1 = ::std::function::operator_cast_to_bool((function *)&this->parse_complete_callback_),
       bVar1)) {
      _process_callbacks(this);
      _process_requirements(this);
      run_callback(this,false,false);
    }
    this_local._7_1_ = 1;
    goto LAB_0016f1f9;
  }
  ::std::operator+(&local_80,"--",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (level_local + 0x18));
  pOVar9 = get_option_no_throw(this,&local_80);
  ::std::__cxx11::string::~string((string *)&local_80);
  local_60 = pOVar9;
  if (pOVar9 == (Option *)0x0) {
    lVar10 = ::std::__cxx11::string::size();
    if (lVar10 == 1) {
      ::std::operator+(&local_a0,"-",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (level_local + 0x18));
      local_60 = get_option_no_throw(this,&local_a0);
      ::std::__cxx11::string::~string((string *)&local_a0);
    }
    if (local_60 == (Option *)0x0) {
      ::std::__cxx11::string::string((string *)&testop,(string *)(level_local + 0x18));
      local_60 = get_option_no_throw(this,(string *)&testop);
      ::std::__cxx11::string::~string((string *)&testop);
    }
    else {
      bVar1 = OptionBase<CLI::Option>::get_configurable(&local_60->super_OptionBase<CLI::Option>);
      if (!bVar1) {
        ::std::__cxx11::string::string((string *)&testop_1,(string *)(level_local + 0x18));
        pOVar9 = get_option_no_throw(this,(string *)&testop_1);
        ::std::__cxx11::string::~string((string *)&testop_1);
        local_c8 = pOVar9;
        if ((pOVar9 != (Option *)0x0) &&
           (bVar1 = OptionBase<CLI::Option>::get_configurable
                              (&pOVar9->super_OptionBase<CLI::Option>), bVar1)) {
          local_60 = local_c8;
        }
      }
    }
  }
  else {
    bVar1 = OptionBase<CLI::Option>::get_configurable(&pOVar9->super_OptionBase<CLI::Option>);
    if (!bVar1) {
      lVar10 = ::std::__cxx11::string::size();
      if (lVar10 == 1) {
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &testop_2,"-",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (level_local + 0x18));
        pOVar9 = get_option_no_throw(this,(string *)&testop_2);
        ::std::__cxx11::string::~string((string *)&testop_2);
        local_f0 = pOVar9;
        if ((pOVar9 != (Option *)0x0) &&
           (bVar1 = OptionBase<CLI::Option>::get_configurable
                              (&pOVar9->super_OptionBase<CLI::Option>), bVar1)) {
          local_60 = local_f0;
        }
      }
      bVar1 = OptionBase<CLI::Option>::get_configurable(&local_60->super_OptionBase<CLI::Option>);
      if (!bVar1) {
        ::std::__cxx11::string::string((string *)&local_138,(string *)(level_local + 0x18));
        pOVar9 = get_option_no_throw(this,&local_138);
        ::std::__cxx11::string::~string((string *)&local_138);
        local_118 = pOVar9;
        if ((pOVar9 != (Option *)0x0) &&
           (bVar1 = OptionBase<CLI::Option>::get_configurable
                              (&pOVar9->super_OptionBase<CLI::Option>), bVar1)) {
          local_60 = local_118;
        }
      }
    }
  }
  if (local_60 == (Option *)0x0) {
    cVar2 = get_allow_config_extras(this);
    if (cVar2 == capture) {
      local_13c = NONE;
      ConfigItem::fullname_abi_cxx11_(&local_160,(ConfigItem *)level_local);
      ::std::
      vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
      ::emplace_back<CLI::detail::Classifier,std::__cxx11::string>
                ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                  *)&this->missing_,&local_13c,&local_160);
      ::std::__cxx11::string::~string((string *)&local_160);
      this_02 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(level_local + 0x38);
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_02);
      input = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(this_02);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&input), bVar1) {
        local_190 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3);
        local_194 = NONE;
        ::std::
        vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
        ::emplace_back<CLI::detail::Classifier,std::__cxx11::string_const&>
                  ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                    *)&this->missing_,&local_194,local_190);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
    }
    this_local._7_1_ = 0;
    goto LAB_0016f1f9;
  }
  bVar1 = OptionBase<CLI::Option>::get_configurable(&local_60->super_OptionBase<CLI::Option>);
  if (!bVar1) {
    cVar2 = get_allow_config_extras(this);
    if (cVar2 != ignore_all) {
      buffer.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      __return_storage_ptr__ = (ConfigError *)__cxa_allocate_exception(0x38);
      ConfigItem::fullname_abi_cxx11_(&local_1b8,(ConfigItem *)level_local);
      ConfigError::NotConfigurable(__return_storage_ptr__,&local_1b8);
      buffer.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      __cxa_throw(__return_storage_ptr__,&ConfigError::typeinfo,ConfigError::~ConfigError);
    }
    this_local._7_1_ = 0;
    goto LAB_0016f1f9;
  }
  bVar1 = Option::empty(local_60);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1d8);
    local_1d9 = 0;
    if (((*(byte *)(level_local + 0x50) & 1) != 0) &&
       (bVar1 = Option::get_inject_separator(local_60), !bVar1)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1d8,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(level_local + 0x38));
      local_1f8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1d8);
      local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1d8);
      local_1f0 = ::std::
                  remove<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[3]>
                            (local_1f8,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_200,(char (*) [3])"%%");
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_1e8,&local_1f0);
      local_210._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1d8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_208,&local_210);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d8,local_1e8,local_208);
      local_1d9 = 1;
    }
    if ((local_1d9 & 1) == 0) {
      local_498 = (undefined1 *)(level_local + 0x38);
    }
    else {
      local_498 = local_1d8;
    }
    res.field_2._8_8_ = local_498;
    iVar6 = Option::get_expected_min(local_60);
    if (iVar6 == 0) {
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(level_local + 0x38));
      if (sVar7 < 2) {
        peVar11 = std::__shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->config_formatter_);
        (*peVar11->_vptr_Config[2])(local_240,peVar11,level_local);
        val._7_1_ = 0;
        bVar1 = OptionBase<CLI::Option>::get_disable_flag_override
                          (&local_60->super_OptionBase<CLI::Option>);
        if (bVar1) {
          ::std::__cxx11::string::string((string *)&local_270,(string *)local_240);
          iVar12 = detail::to_flag_value(&local_270);
          ::std::__cxx11::string::~string((string *)&local_270);
          pOVar9 = local_60;
          local_250 = iVar12;
          if (iVar12 == 1) {
            psVar14 = (string *)(level_local + 0x18);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_2b0,"{}",&local_2b1);
            Option::get_flag_value(&local_290,pOVar9,psVar14,&local_2b0);
            ::std::__cxx11::string::operator=((string *)local_240,(string *)&local_290);
            ::std::__cxx11::string::~string((string *)&local_290);
            ::std::__cxx11::string::~string((string *)&local_2b0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
            val._7_1_ = 1;
          }
        }
        if ((val._7_1_ & 1) == 0) {
          piVar13 = __errno_location();
          *piVar13 = 0;
          bVar1 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_240,"{}");
          if ((bVar1) || (iVar6 = Option::get_expected_max(local_60), iVar6 < 2)) {
            pOVar9 = local_60;
            psVar14 = (string *)(level_local + 0x18);
            ::std::__cxx11::string::string((string *)&local_2f8,(string *)local_240);
            Option::get_flag_value(&local_2d8,pOVar9,psVar14,&local_2f8);
            ::std::__cxx11::string::operator=((string *)local_240,(string *)&local_2d8);
            ::std::__cxx11::string::~string((string *)&local_2d8);
            ::std::__cxx11::string::~string((string *)&local_2f8);
          }
        }
        pOVar9 = local_60;
        ::std::__cxx11::string::string((string *)&local_318,(string *)local_240);
        Option::add_result(pOVar9,&local_318);
        ::std::__cxx11::string::~string((string *)&local_318);
        this_local._7_1_ = 1;
        local_31c = 1;
        ::std::__cxx11::string::~string((string *)local_240);
      }
      else {
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)res.field_2._8_8_);
        iVar6 = Option::get_items_expected_max(local_60);
        if (((int)sVar7 <= iVar6) ||
           (MVar3 = OptionBase<CLI::Option>::get_multi_option_policy
                              (&local_60->super_OptionBase<CLI::Option>), MVar3 == TakeAll))
        goto LAB_0016f157;
        iVar6 = Option::get_items_expected_max(local_60);
        if (1 < iVar6) {
          local_341 = 1;
          __return_storage_ptr___00 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
          ConfigItem::fullname_abi_cxx11_(&local_340,(ConfigItem *)level_local);
          iVar6 = Option::get_items_expected_max(local_60);
          sVar7 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)res.field_2._8_8_);
          ArgumentMismatch::AtMost(__return_storage_ptr___00,&local_340,iVar6,sVar7);
          local_341 = 0;
          __cxa_throw(__return_storage_ptr___00,&ArgumentMismatch::typeinfo,
                      ArgumentMismatch::~ArgumentMismatch);
        }
        bVar1 = OptionBase<CLI::Option>::get_disable_flag_override
                          (&local_60->super_OptionBase<CLI::Option>);
        this_00 = res.field_2._8_8_;
        if (!bVar1) {
          __return_storage_ptr___01 = (ConversionError *)__cxa_allocate_exception(0x38);
          ConfigItem::fullname_abi_cxx11_(&local_368,(ConfigItem *)level_local);
          ConversionError::TooManyInputsFlag(__return_storage_ptr___01,&local_368);
          __cxa_throw(__return_storage_ptr___01,&ConversionError::typeinfo,
                      ConversionError::~ConversionError);
        }
        __end4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)res.field_2._8_8_);
        res_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&res_1), bVar1) {
          __lhs = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end4);
          bVar1 = false;
          bVar4 = std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::empty(&local_60->default_flag_values_);
          if (bVar4) {
            bVar4 = ::std::operator==(__lhs,"true");
            if ((((bVar4) || (bVar4 = ::std::operator==(__lhs,"false"), bVar4)) ||
                (bVar4 = ::std::operator==(__lhs,"1"), bVar4)) ||
               (bVar4 = ::std::operator==(__lhs,"0"), bVar4)) {
              bVar1 = true;
            }
          }
          else {
            this_03 = &local_60->default_flag_values_;
            __end6 = std::
                     vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::begin(this_03);
            valid_res = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)std::
                           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::end(this_03);
            while (bVar4 = __gnu_cxx::operator!=
                                     (&__end6,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                               *)&valid_res), bVar4) {
              local_3b8 = __gnu_cxx::
                          __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ::operator*(&__end6);
              _Var5 = ::std::operator==(&local_3b8->second,__lhs);
              if (_Var5) {
                bVar1 = true;
                break;
              }
              __gnu_cxx::
              __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator++(&__end6);
            }
          }
          pOVar9 = local_60;
          if (!bVar1) {
            local_3fa = 1;
            this_04 = (InvalidError *)__cxa_allocate_exception(0x38);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_3f8,"invalid flag argument given",&local_3f9);
            InvalidError::InvalidError(this_04,&local_3f8);
            local_3fa = 0;
            __cxa_throw(this_04,&InvalidError::typeinfo,InvalidError::~InvalidError);
          }
          ::std::__cxx11::string::string((string *)&local_3d8,(string *)__lhs);
          Option::add_result(pOVar9,&local_3d8);
          ::std::__cxx11::string::~string((string *)&local_3d8);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end4);
        }
        this_local._7_1_ = 1;
        local_31c = 1;
      }
    }
    else {
LAB_0016f157:
      pOVar9 = local_60;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_418,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)res.field_2._8_8_);
      Option::add_result(pOVar9,&local_418);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_418);
      Option::run_callback(local_60);
      local_31c = 0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d8);
    if (local_31c != 0) goto LAB_0016f1f9;
  }
  this_local._7_1_ = 1;
LAB_0016f1f9:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

CLI11_INLINE bool App::_parse_single_config(const ConfigItem &item, std::size_t level) {

    if(level < item.parents.size()) {
        auto *subcom = get_subcommand_no_throw(item.parents.at(level));
        return (subcom != nullptr) ? subcom->_parse_single_config(item, level + 1) : false;
    }
    // check for section open
    if(item.name == "++") {
        if(configurable_) {
            increment_parsed();
            _trigger_pre_parse(2);
            if(parent_ != nullptr) {
                parent_->parsed_subcommands_.push_back(this);
            }
        }
        return true;
    }
    // check for section close
    if(item.name == "--") {
        if(configurable_ && parse_complete_callback_) {
            _process_callbacks();
            _process_requirements();
            run_callback();
        }
        return true;
    }
    Option *op = get_option_no_throw("--" + item.name);
    if(op == nullptr) {
        if(item.name.size() == 1) {
            op = get_option_no_throw("-" + item.name);
        }
        if(op == nullptr) {
            op = get_option_no_throw(item.name);
        } else if(!op->get_configurable()) {
            auto *testop = get_option_no_throw(item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
    } else if(!op->get_configurable()) {
        if(item.name.size() == 1) {
            auto *testop = get_option_no_throw("-" + item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
        if(!op->get_configurable()) {
            auto *testop = get_option_no_throw(item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
    }

    if(op == nullptr) {
        // If the option was not present
        if(get_allow_config_extras() == config_extras_mode::capture) {
            // Should we worry about classifying the extras properly?
            missing_.emplace_back(detail::Classifier::NONE, item.fullname());
            for(const auto &input : item.inputs) {
                missing_.emplace_back(detail::Classifier::NONE, input);
            }
        }
        return false;
    }

    if(!op->get_configurable()) {
        if(get_allow_config_extras() == config_extras_mode::ignore_all) {
            return false;
        }
        throw ConfigError::NotConfigurable(item.fullname());
    }
    if(op->empty()) {
        std::vector<std::string> buffer;  // a buffer to use for copying an modifying inputs in a few cases
        bool useBuffer{false};
        if(item.multiline) {
            if(!op->get_inject_separator()) {
                buffer = item.inputs;
                buffer.erase(std::remove(buffer.begin(), buffer.end(), "%%"), buffer.end());
                useBuffer = true;
            }
        }
        const std::vector<std::string> &inputs = (useBuffer) ? buffer : item.inputs;
        if(op->get_expected_min() == 0) {
            if(item.inputs.size() <= 1) {
                // Flag parsing
                auto res = config_formatter_->to_flag(item);
                bool converted{false};
                if(op->get_disable_flag_override()) {
                    auto val = detail::to_flag_value(res);
                    if(val == 1) {
                        res = op->get_flag_value(item.name, "{}");
                        converted = true;
                    }
                }

                if(!converted) {
                    errno = 0;
                    if(res != "{}" || op->get_expected_max() <= 1) {
                        res = op->get_flag_value(item.name, res);
                    }
                }

                op->add_result(res);
                return true;
            }
            if(static_cast<int>(inputs.size()) > op->get_items_expected_max() &&
               op->get_multi_option_policy() != MultiOptionPolicy::TakeAll) {
                if(op->get_items_expected_max() > 1) {
                    throw ArgumentMismatch::AtMost(item.fullname(), op->get_items_expected_max(), inputs.size());
                }

                if(!op->get_disable_flag_override()) {
                    throw ConversionError::TooManyInputsFlag(item.fullname());
                }
                // if the disable flag override is set then we must have the flag values match a known flag value
                // this is true regardless of the output value, so an array input is possible and must be accounted for
                for(const auto &res : inputs) {
                    bool valid_value{false};
                    if(op->default_flag_values_.empty()) {
                        if(res == "true" || res == "false" || res == "1" || res == "0") {
                            valid_value = true;
                        }
                    } else {
                        for(const auto &valid_res : op->default_flag_values_) {
                            if(valid_res.second == res) {
                                valid_value = true;
                                break;
                            }
                        }
                    }

                    if(valid_value) {
                        op->add_result(res);
                    } else {
                        throw InvalidError("invalid flag argument given");
                    }
                }
                return true;
            }
        }
        op->add_result(inputs);
        op->run_callback();
    }

    return true;
}